

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardsurface.h
# Opt level: O1

bool __thiscall
rengine::StandardSurface::deliverPointerEventInScene
          (StandardSurface *this,Node *node,PointerEvent *e)

{
  vec2 p;
  bool bVar1;
  int iVar2;
  Node *node_00;
  RectangleNodeBase *rectNode;
  float fVar3;
  float fVar4;
  float fVar5;
  mat4 local_c8;
  undefined1 local_84 [8];
  mat4 nodeInvMatrix;
  rect2d area;
  bool inv;
  
  if (node == (Node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/standardsurface.h"
                  ,0xa1,
                  "bool rengine::StandardSurface::deliverPointerEventInScene(Node *, PointerEvent *)"
                 );
  }
  if (e != (PointerEvent *)0x0) {
    if (node->m_child == (Node *)0x0) {
      node_00 = (Node *)0x0;
    }
    else {
      node_00 = node->m_child->m_prev;
    }
    for (; node_00 != (Node *)0x0; node_00 = Node::previousSibling(node_00)) {
      bVar1 = deliverPointerEventInScene(this,node_00,e);
      if (bVar1) {
        return true;
      }
    }
    if ((~*(uint *)&node->field_0x30 & 0x440) == 0) {
      nodeInvMatrix._60_8_ = *(undefined8 *)&node->field_0x34;
      area.tl = *(vec2 *)((long)&node[1].super_SignalEmitter._vptr_SignalEmitter + 4);
      area.br.y._3_1_ = '\0';
      TransformNode::matrixFor
                (&local_c8,node,
                 ((this->m_renderer)._M_t.
                  super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>
                  .super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl)->m_sceneRoot);
      mat4::inverted((mat4 *)local_84,&local_c8,(bool *)((long)&area.br.y + 3));
      if (area.br.y._3_1_ == '\x01') {
        fVar5 = (e->m_posInSurface).x;
        fVar4 = (e->m_posInSurface).y;
        fVar3 = (float)local_84._0_4_ * fVar5 + (float)local_84._4_4_ * fVar4 + nodeInvMatrix.m[1];
        fVar5 = nodeInvMatrix.m[2] * fVar5 + fVar4 * nodeInvMatrix.m[3] + nodeInvMatrix.m[5];
        *(ulong *)&(e->super_Event).field_0xc = CONCAT44(fVar5,fVar3);
        p.y = fVar5;
        p.x = fVar3;
        bVar1 = rect2d::contains((rect2d *)(nodeInvMatrix.m + 0xf),p);
        if ((bVar1) &&
           (iVar2 = (*(node->super_SignalEmitter)._vptr_SignalEmitter[3])(node,e),
           (char)iVar2 != '\0')) {
          return true;
        }
      }
    }
    return false;
  }
  __assert_fail("e",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/standardsurface.h"
                ,0xa2,
                "bool rengine::StandardSurface::deliverPointerEventInScene(Node *, PointerEvent *)")
  ;
}

Assistant:

inline bool StandardSurface::deliverPointerEventInScene(Node *node, PointerEvent *e)
{
    assert(node);
    assert(e);

    // Traverse children in backwards order (and bottom up), so we get
    // inverse-paint order delivery
    Node *child = node->lastChild();
    while (child) {
        if (deliverPointerEventInScene(child, e))
            return true;
        child = child->previousSibling();
    }
    if (node->isPointerTarget()) {
        RectangleNodeBase *rectNode = RectangleNodeBase::from(node);
        if (rectNode) {
            rect2d area = rectNode->geometry();
            bool inv = false;
            mat4 nodeInvMatrix = TransformNode::matrixFor(node, m_renderer->sceneRoot()).inverted(&inv);

            // can only be inside if the matrix is invertible, as otherwise
            // the node will be "collapsed" in some dimension
            if (inv) {
                // Note that this doesn't bother to unset the position afterwards as
                // we will either:
                // 1. accept it and the value is correct
                // 2. reject it and the value will be written next time we try..
                e->setPosition(nodeInvMatrix * e->positionInSurface());
                if (area.contains(e->position()) && node->onPointerEvent(e))
                    return true;
            }
        }
    }

    return false;
}